

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

FieldSubset * __thiscall
capnp::StructSchema::getUnionFields(FieldSubset *__return_storage_ptr__,StructSchema *this)

{
  RawBrandedSchema *pRVar1;
  uint16_t *puVar2;
  uint uVar3;
  Reader local_80;
  Reader local_50;
  
  Schema::getProto(&local_50,&this->super_Schema);
  pRVar1 = (this->super_Schema).raw;
  capnp::schema::Node::Struct::Reader::getFields(&local_80,(Reader *)&local_50);
  puVar2 = ((this->super_Schema).raw)->generic->membersByDiscriminant;
  uVar3 = 0;
  if (0xff < local_50._reader.dataSize) {
    uVar3 = (uint)*(ushort *)((long)local_50._reader.data + 0x1e);
  }
  (__return_storage_ptr__->list).reader.structDataSize = local_80.reader.structDataSize;
  (__return_storage_ptr__->list).reader.structPointerCount = local_80.reader.structPointerCount;
  (__return_storage_ptr__->list).reader.elementSize = local_80.reader.elementSize;
  (__return_storage_ptr__->list).reader.field_0x27 = local_80.reader._39_1_;
  (__return_storage_ptr__->list).reader.nestingLimit = local_80.reader.nestingLimit;
  *(undefined4 *)&(__return_storage_ptr__->list).reader.field_0x2c = local_80.reader._44_4_;
  (__return_storage_ptr__->list).reader.ptr = local_80.reader.ptr;
  (__return_storage_ptr__->list).reader.elementCount = local_80.reader.elementCount;
  (__return_storage_ptr__->list).reader.step = local_80.reader.step;
  (__return_storage_ptr__->list).reader.segment = local_80.reader.segment;
  (__return_storage_ptr__->list).reader.capTable = local_80.reader.capTable;
  (__return_storage_ptr__->parent).super_Schema.raw = pRVar1;
  __return_storage_ptr__->indices = puVar2;
  __return_storage_ptr__->size_ = uVar3;
  return __return_storage_ptr__;
}

Assistant:

StructSchema::FieldSubset StructSchema::getUnionFields() const {
  auto proto = getProto().getStruct();
  return FieldSubset(*this, proto.getFields(),
                     raw->generic->membersByDiscriminant, proto.getDiscriminantCount());
}